

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_ipv4_increasing::test_method(test_ipv4_increasing *this)

{
  undefined4 local_e8;
  value local_e4;
  char input [8];
  view_type local_d8;
  undefined8 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  authority reader;
  
  local_d8.ptr_ = input;
  builtin_strncpy(input,"0.1.2.3",8);
  local_d8.len_ = strlen(local_d8.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_d8);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x53);
  local_d8.len_ = local_d8.len_ & 0xffffffffffffff00;
  local_d8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_80 = "";
  local_e4 = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_e8 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_d8,&local_88,0x53,2,2,&local_e4,"reader.subcode()",&local_e8,
             "url::token::subcode::authority_host_ipv4");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x54);
  local_d8.len_ = local_d8.len_ & 0xffffffffffffff00;
  local_d8.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[8]>
            (&local_d8,&local_b8,0x54,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","0.1.2.3","\"0.1.2.3\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv4_increasing)
{
    const char input[] = "0.1.2.3";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv4);
    BOOST_REQUIRE_EQUAL(reader.literal(), "0.1.2.3");
}